

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O0

void LoadObjectTypes(Level *NewLev,int radius)

{
  int iVar1;
  long *name;
  ObjectType *pOVar2;
  ALLEGRO_BITMAP *pAVar3;
  ALLEGRO_SAMPLE *pAVar4;
  int in_ESI;
  long in_RDI;
  int h;
  int w;
  ObjectType **NewObjectPtr;
  int local_28;
  
  name = (long *)(in_RDI + 0xb8);
  ExpectToken(TK_OPENBRACE);
  while( true ) {
    GetToken();
    if (Token.Type != TK_OPENBRACE) {
      if (Token.Type != TK_CLOSEBRACE) {
        Error = 1;
      }
      return;
    }
    pOVar2 = NewObjectType();
    *name = (long)pOVar2;
    ExpectToken(TK_OPENBRACE);
    pAVar3 = ObtainBitmap((char *)name);
    *(ALLEGRO_BITMAP **)*name = pAVar3;
    if (pAVar3 == (ALLEGRO_BITMAP *)0x0) break;
    iVar1 = al_get_bitmap_width(*(undefined8 *)*name);
    local_28 = al_get_bitmap_height(*(undefined8 *)*name);
    if (local_28 < iVar1) {
      local_28 = iVar1;
    }
    *(int *)(*name + 0x10) = local_28;
    *(int *)(*name + 0x10) = in_ESI + *(int *)(*name + 0x10);
    ExpectToken(TK_OPENBRACE);
    ExpectToken(TK_OPENBRACE);
    pAVar4 = ObtainSample((char *)name);
    *(ALLEGRO_SAMPLE **)(*name + 8) = pAVar4;
    ExpectToken(TK_OPENBRACE);
    name = (long *)(*name + 0x18);
  }
  Error = 1;
  snprintf(ErrorText,0x400,"Could not load object image %s at line %d",0x12193c,(ulong)(uint)Lines);
  return;
}

Assistant:

void LoadObjectTypes(struct Level *NewLev, int radius)
{
   struct ObjectType **NewObjectPtr = &NewLev->AllObjectTypes;
   int w, h;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               *NewObjectPtr = NewObjectType();

               ExpectToken(TK_STRING);
               if (!((*NewObjectPtr)->Image = ObtainBitmap(Token.Text))) {
                  Error = 1;
                  snprintf(ErrorText, sizeof(ErrorText),
                            "Could not load object image %s at line %d",
                            Token.Text, Lines);
                  return;
               }
               w = al_get_bitmap_width((*NewObjectPtr)->Image);
               h = al_get_bitmap_height((*NewObjectPtr)->Image);
               (*NewObjectPtr)->Radius = w > h ? w : h;
               (*NewObjectPtr)->Radius += radius;

               ExpectToken(TK_COMMA);
               ExpectToken(TK_STRING);

               /* this doesn't generate an error as it is permissible to have objects that don't make a noise when collected */
               (*NewObjectPtr)->CollectNoise = ObtainSample(Token.Text);

               ExpectToken(TK_CLOSEBRACE);
               NewObjectPtr = &(*NewObjectPtr)->Next;
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}